

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<pbrt::Point2<float>_>::Array2D
          (Array2D<pbrt::Point2<float>_> *this,Bounds2i *extent,Allocator allocator)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  Point2<float> *pPVar2;
  uint uVar3;
  ulong uVar4;
  polymorphic_allocator<std::byte> local_18;
  
  TVar1 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar1;
  (this->allocator).memoryResource = allocator.memoryResource;
  uVar3 = ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y) *
          ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.x -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x);
  local_18.memoryResource = allocator.memoryResource;
  pPVar2 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Point2<float>>
                     (&local_18,(long)(int)uVar3);
  this->values = pPVar2;
  for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
    pPVar2 = this->values;
    pPVar2[uVar4].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
    pPVar2[uVar4].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }